

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void cpu_stw_data_ra_mipsel
               (CPUArchState_conflict8 *env,target_ulong_conflict ptr,uint32_t val,uintptr_t retaddr
               )

{
  uint mmu_idx;
  
  mmu_idx = 3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    mmu_idx = env->hflags & 3;
  }
  cpu_stw_mmuidx_ra_mipsel(env,ptr,val,mmu_idx,retaddr);
  return;
}

Assistant:

void cpu_stw_data_ra(CPUArchState *env, target_ulong ptr,
                     uint32_t val, uintptr_t retaddr)
{
    cpu_stw_mmuidx_ra(env, ptr, val, cpu_mmu_index(env, false), retaddr);
}